

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void * __thiscall
ON_FixedSizePoolIterator::NextBlock(ON_FixedSizePoolIterator *this,size_t *block_element_count)

{
  long *plVar1;
  ON_FixedSizePool *pOVar2;
  long *plVar3;
  ulong uVar4;
  void **ppvVar5;
  
  plVar1 = (long *)this->m_it_block;
  if (plVar1 == (long *)0x0) {
LAB_00491933:
    this->m_it_block = (void *)0x0;
    this->m_it_element = (void *)0x0;
    if (block_element_count == (size_t *)0x0) goto LAB_00491943;
LAB_0049193e:
    uVar4 = 0;
  }
  else {
    pOVar2 = this->m_fsp;
    plVar3 = (long *)pOVar2->m_al_block;
    if ((plVar1 == plVar3) || ((long *)this->m_it_element != plVar1 + 2)) goto LAB_00491933;
    plVar1 = (long *)*plVar1;
    this->m_it_block = plVar1;
    if (plVar1 == (long *)pOVar2->m_al_element_array) goto LAB_00491933;
    this->m_it_element = plVar1 + 2;
    if (block_element_count == (size_t *)0x0) goto LAB_00491943;
    if ((plVar1 == (long *)0x0) || (pOVar2->m_sizeof_element == 0)) goto LAB_0049193e;
    ppvVar5 = &pOVar2->m_al_element_array;
    if (pOVar2->m_al_count == 0) {
      ppvVar5 = (void **)(plVar1 + 1);
    }
    if (plVar3 != plVar1) {
      ppvVar5 = (void **)(plVar1 + 1);
    }
    uVar4 = (ulong)((long)*ppvVar5 - (long)(plVar1 + 2)) / pOVar2->m_sizeof_element;
  }
  *block_element_count = uVar4;
LAB_00491943:
  return this->m_it_element;
}

Assistant:

void* ON_FixedSizePoolIterator::NextBlock( size_t* block_element_count )
{
  if ( 0 != m_it_block
       && m_it_block != m_fsp->m_al_block
       && m_it_element == (void*)(((char*)m_it_block)+2*sizeof(void*)) )
  {
    m_it_block = *((void**)m_it_block);
    if ( m_it_block == m_fsp->m_al_element_array )
    {
      m_it_block = 0;
      m_it_element = 0;
      if ( 0 != block_element_count )
        *block_element_count = 0;
    }
    else
    {
      m_it_element = (void*)(((char*)m_it_block)+2*sizeof(void*)); // m_it_element points to first element in m_first_block
      if ( 0 != block_element_count )
        *block_element_count = m_fsp->BlockElementCount(m_it_block);
    }
  }
  else
  {
    m_it_block = 0;
    m_it_element = 0;
    if ( 0 != block_element_count )
      *block_element_count = 0;
  }
  return m_it_element;
}